

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

void chaiscript::bootstrap::Bootstrap::bootstrap(Module *m)

{
  Type_Info ti;
  Type_Info ti_00;
  Type_Info ti_01;
  Type_Info ti_02;
  Type_Info ti_03;
  Type_Info ti_04;
  Type_Info ti_05;
  Type_Info ti_06;
  Type_Info ti_07;
  Type_Info ti_08;
  Type_Info ti_09;
  Type_Info ti_10;
  Type_Info ti_11;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_> __l_01;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  Module *pMVar1;
  offset_in_Proxy_Function_Base_to_subr *f;
  offset_in_Proxy_Function_Base_to_subr *f_00;
  Bootstrap *pBVar2;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2600;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *local_25a0;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2588;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2548;
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1ebb;
  undefined1 local_1eba;
  anon_class_1_0_00000001_for_m_f local_1eb9;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1eb8;
  code *local_1ea8;
  undefined8 local_1ea0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1e98;
  code *local_1e88;
  undefined8 local_1e80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1e78;
  code *local_1e68;
  undefined8 local_1e60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1e58;
  code *local_1e48;
  undefined8 local_1e40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1e38;
  offset_in_AST_Node_to_unknown local_1e28;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1e20;
  offset_in_AST_Node_to_unknown local_1e10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1e08;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1df8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1df0;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1dc0;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d90;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d60;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d30;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d00;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1cd0;
  undefined1 local_1ca0 [40];
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_1c78;
  allocator<char> local_1c51;
  string local_1c50;
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c2a;
  undefined1 local_1c29;
  offset_in_File_Position_to_int local_1c28;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1c20;
  offset_in_File_Position_to_int local_1c10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1c08;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1bf8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1bf0;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1bc0;
  undefined1 local_1b90 [47];
  allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_> local_1b61;
  undefined1 *local_1b60;
  undefined1 local_1b58 [32];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1b38;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_1b28;
  allocator<char> local_1b09;
  string local_1b08;
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1ae3;
  undefined1 local_1ae2;
  anon_class_1_0_00000001_for_m_f local_1ae1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1ae0;
  code *local_1ad0;
  undefined8 local_1ac8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1ac0;
  offset_in_eval_error_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  local_1ab0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1aa8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a98;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a90;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a60;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a30;
  undefined1 local_1a00 [40];
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_19d8;
  allocator<char> local_19b9;
  string local_19b8;
  Type_Conversion local_1998;
  Type_Conversion local_1988;
  allocator<char> local_1971;
  string local_1970;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  Type_Conversion local_1938;
  Type_Conversion local_1928;
  allocator<char> local_1911;
  string local_1910;
  _func_AST_Node_ptr_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr *local_18f0;
  Proxy_Function local_18e8;
  allocator<char> local_18d1;
  string local_18d0;
  _func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr *local_18b0;
  Proxy_Function local_18a8;
  allocator<char> local_1891;
  string local_1890;
  _func_bool_Boxed_Value_ptr_Boxed_Value_ptr *local_1870;
  Proxy_Function local_1868;
  allocator<char> local_1851;
  string local_1850;
  anon_class_1_0_00000001_for_m_f local_1829;
  Proxy_Function local_1828;
  Type_Conversion local_1818;
  allocator<char> local_1801;
  string local_1800;
  _func_Boxed_Value_Boxed_Value_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  *local_17e0;
  Proxy_Function local_17d8;
  allocator<char> local_17c1;
  string local_17c0;
  _func_Boxed_Value_Boxed_Value_shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_ptr
  *local_17a0;
  Proxy_Function local_1798;
  allocator<char> local_1781;
  string local_1780;
  _func_shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  *local_1760;
  Proxy_Function local_1758;
  allocator<char> local_1741;
  string local_1740;
  _func_Boxed_Value_Function_Params_ptr *local_1720;
  Proxy_Function local_1718;
  allocator<char> local_1701;
  string local_1700;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *local_16e0;
  Proxy_Function local_16d8;
  allocator<char> local_16c1;
  string local_16c0;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *local_16a0;
  Proxy_Function local_1698;
  allocator<char> local_1681;
  string local_1680;
  _func_bool *local_1660;
  Proxy_Function local_1658;
  allocator<char> local_1641;
  string local_1640;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1620;
  Proxy_Function local_1618;
  allocator<char> local_1601;
  string local_1600;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_15e0;
  Proxy_Function local_15d8;
  allocator<char> local_15c1;
  string local_15c0;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_15a0;
  Proxy_Function local_1598;
  allocator<char> local_1581;
  string local_1580;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1560;
  Proxy_Function local_1558;
  allocator<char> local_1541;
  string local_1540;
  _func_int *local_1520;
  Proxy_Function local_1518;
  allocator<char> local_1501;
  string local_1500;
  _func_int *local_14e0;
  Proxy_Function local_14d8;
  allocator<char> local_14c1;
  string local_14c0;
  _func_int *local_14a0;
  Proxy_Function local_1498;
  allocator<char> local_1481;
  string local_1480;
  allocator<char> local_1459;
  string local_1458;
  allocator<char> local_1431;
  string local_1430;
  allocator<char> local_1409;
  string local_1408;
  allocator<char> local_13e1;
  string local_13e0;
  allocator<char> local_13b9;
  string local_13b8;
  allocator<char> local_1391;
  string local_1390;
  allocator<char> local_1369;
  string local_1368;
  allocator<char> local_1341;
  string local_1340;
  allocator<char> local_1319;
  string local_1318;
  allocator<char> local_12f1;
  string local_12f0;
  allocator<char> local_12c9;
  string local_12c8;
  allocator<char> local_12a1;
  string local_12a0;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  allocator<char> local_11b1;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  allocator<char> local_1111;
  string local_1110;
  code *local_10f0;
  undefined8 local_10e8;
  Proxy_Function local_10e0;
  allocator<char> local_10c9;
  string local_10c8;
  anon_class_1_0_00000001_for_m_f local_10a1;
  Proxy_Function local_10a0;
  allocator<char> local_1089;
  string local_1088;
  anon_class_1_0_00000001_for_m_f local_1061;
  Proxy_Function local_1060;
  allocator<char> local_1049;
  string local_1048;
  _func_Boxed_Value_Boxed_Value_Boxed_Value *local_1028;
  Proxy_Function local_1020;
  allocator<char> local_1009;
  string local_1008;
  anon_class_1_0_00000001_for_m_f local_fe1;
  Proxy_Function local_fe0;
  allocator<char> local_fc9;
  string local_fc8;
  anon_class_1_0_00000001_for_m_f local_fa1;
  Proxy_Function local_fa0;
  allocator<char> local_f89;
  string local_f88;
  allocator<char> local_f61;
  string local_f60;
  code *local_f40;
  undefined8 local_f38;
  Proxy_Function local_f30;
  allocator<char> local_f19;
  string local_f18;
  code *local_ef8;
  undefined8 local_ef0;
  Proxy_Function local_ee8;
  allocator<char> local_ed1;
  string local_ed0;
  code *local_eb0;
  undefined8 local_ea8;
  Proxy_Function local_ea0;
  allocator<char> local_e89;
  string local_e88;
  code *local_e68;
  undefined8 local_e60;
  Proxy_Function local_e58;
  allocator<char> local_e41;
  string local_e40;
  code *local_e20;
  undefined8 local_e18;
  Proxy_Function local_e10;
  allocator<char> local_df9;
  string local_df8;
  code *local_dd8;
  undefined8 local_dd0;
  Proxy_Function local_dc8;
  allocator<char> local_db1;
  string local_db0;
  code *local_d90;
  undefined8 local_d88;
  Proxy_Function local_d80;
  allocator<char> local_d69;
  string local_d68;
  code *local_d48;
  undefined8 local_d40;
  Proxy_Function local_d38;
  allocator<char> local_d21;
  string local_d20;
  code *local_d00;
  undefined8 local_cf8;
  Proxy_Function local_cf0;
  allocator<char> local_cd9;
  string local_cd8;
  Proxy_Function local_cb8;
  allocator<char> local_ca1;
  string local_ca0;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  allocator<char> local_c61;
  string local_c60;
  code *local_c40;
  undefined8 local_c38;
  Proxy_Function local_c30;
  allocator<char> local_c19;
  string local_c18;
  code *local_bf8;
  undefined8 local_bf0;
  Proxy_Function local_be8;
  allocator<char> local_bd1;
  string local_bd0;
  code *local_bb0;
  undefined8 local_ba8;
  Proxy_Function local_ba0;
  allocator<char> local_b89;
  string local_b88;
  code *local_b68;
  undefined8 local_b60;
  Proxy_Function local_b58;
  allocator<char> local_b41;
  string local_b40;
  code *local_b20;
  undefined8 local_b18;
  Proxy_Function local_b10;
  allocator<char> local_af9;
  string local_af8;
  code *local_ad8;
  undefined8 local_ad0;
  Proxy_Function local_ac8;
  allocator<char> local_ab1;
  string local_ab0;
  code *local_a90;
  undefined8 local_a88;
  Proxy_Function local_a80;
  allocator<char> local_a69;
  string local_a68;
  code *local_a48;
  undefined8 local_a40;
  Proxy_Function local_a38;
  allocator<char> local_a21;
  string local_a20;
  code *local_a00;
  undefined8 local_9f8;
  Proxy_Function local_9f0;
  allocator<char> local_9d9;
  string local_9d8;
  code *local_9b8;
  undefined8 local_9b0;
  Proxy_Function local_9a8;
  allocator<char> local_991;
  string local_990;
  code *local_970;
  undefined8 local_968;
  Proxy_Function local_960;
  allocator<char> local_949;
  string local_948;
  code *local_928;
  undefined8 local_920;
  Proxy_Function local_918;
  allocator<char> local_901;
  string local_900;
  _func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  *local_8e0;
  Proxy_Function local_8d8;
  allocator<char> local_8c1;
  string local_8c0;
  _func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr *local_8a0;
  Proxy_Function local_898;
  allocator<char> local_881;
  string local_880;
  allocator<char> local_859;
  string local_858;
  code *local_838;
  undefined8 local_830;
  Proxy_Function local_828;
  allocator<char> local_811;
  string local_810;
  code *local_7f0;
  undefined8 local_7e8;
  Proxy_Function local_7e0;
  allocator<char> local_7c9;
  string local_7c8;
  code *local_7a8;
  undefined8 local_7a0;
  Proxy_Function local_798;
  allocator<char> local_781;
  string local_780;
  code *local_760;
  undefined8 local_758;
  Proxy_Function local_750;
  allocator<char> local_739;
  string local_738;
  code *local_718;
  undefined8 local_710;
  Proxy_Function local_708;
  allocator<char> local_6f1;
  string local_6f0;
  code *local_6d0;
  undefined8 local_6c8;
  Proxy_Function local_6c0;
  allocator<char> local_6a9;
  string local_6a8;
  code *local_688;
  undefined8 local_680;
  Proxy_Function local_678;
  allocator<char> local_661;
  string local_660;
  code *local_640;
  undefined8 local_638;
  Proxy_Function local_630;
  allocator<char> local_619;
  string local_618;
  code *local_5f8;
  undefined8 local_5f0;
  Proxy_Function local_5e8;
  allocator<char> local_5d1;
  string local_5d0;
  code *local_5b0;
  undefined8 local_5a8;
  Proxy_Function local_5a0;
  allocator<char> local_589;
  string local_588;
  code *local_568;
  undefined8 local_560;
  Proxy_Function local_558;
  allocator<char> local_541;
  string local_540;
  Proxy_Function local_520;
  allocator<char> local_509;
  string local_508;
  Proxy_Function local_4e8;
  allocator<char> local_4d1;
  string local_4d0;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  allocator<char> local_491;
  string local_490;
  Proxy_Function local_470;
  Type_Conversion local_460;
  allocator<char> local_449;
  string local_448;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  Type_Conversion local_410;
  Type_Conversion local_400;
  Type_Conversion local_3f0;
  allocator<char> local_3d9;
  string local_3d8;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  allocator<char> local_399;
  string local_398;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  allocator<char> local_359;
  string local_358;
  anon_class_1_0_00000001_for_m_f local_331;
  Proxy_Function local_330;
  allocator<char> local_319;
  string local_318;
  anon_class_16_1_54a39806_for_m_f local_2f8;
  anon_class_16_1_54a39806_for_m_f local_2e8;
  Proxy_Function local_2d8;
  allocator<char> local_2c1;
  string local_2c0;
  anon_class_16_1_54a39806_for_m_f local_2a0;
  anon_class_16_1_54a39806_for_m_f local_290;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_280;
  allocator<char> local_269;
  string local_268;
  offset_in_Proxy_Function_Base_to_subr local_248 [2];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_238;
  allocator<char> local_221;
  string local_220;
  code *local_200;
  undefined8 local_1f8;
  Proxy_Function local_1f0;
  allocator<char> local_1d9;
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  allocator<char> local_199;
  string local_198;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  allocator<char> local_159;
  string local_158;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  allocator<char> local_119;
  string local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  allocator<char> local_d9;
  string local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  allocator<char> local_99;
  string local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  allocator<char> local_49;
  string local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  Module *local_10;
  Module *m_local;
  
  local_10 = m;
  user_type<void>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"void",&local_49);
  ti.m_bare_type_info = (type_info *)uStack_20;
  ti.m_type_info = (type_info *)local_28;
  ti._16_8_ = local_18;
  Module::add(m,ti,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pMVar1 = local_10;
  user_type<bool>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"bool",&local_99);
  ti_00.m_bare_type_info = (type_info *)uStack_70;
  ti_00.m_type_info = (type_info *)local_78;
  ti_00._16_8_ = local_68;
  Module::add(pMVar1,ti_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pMVar1 = local_10;
  user_type<chaiscript::Boxed_Value>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Object",&local_d9);
  ti_01.m_bare_type_info = (type_info *)uStack_b0;
  ti_01.m_type_info = (type_info *)local_b8;
  ti_01._16_8_ = local_a8;
  Module::add(pMVar1,ti_01,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pMVar1 = local_10;
  user_type<chaiscript::Boxed_Number>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Number",&local_119);
  ti_02.m_bare_type_info = (type_info *)uStack_f0;
  ti_02.m_type_info = (type_info *)local_f8;
  ti_02._16_8_ = local_e8;
  Module::add(pMVar1,ti_02,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  pMVar1 = local_10;
  user_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Function",&local_159);
  ti_03.m_bare_type_info = (type_info *)uStack_130;
  ti_03.m_type_info = (type_info *)local_138;
  ti_03._16_8_ = local_128;
  Module::add(pMVar1,ti_03,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pMVar1 = local_10;
  user_type<chaiscript::dispatch::Assignable_Proxy_Function>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Assignable_Function",&local_199);
  ti_04.m_bare_type_info = (type_info *)uStack_170;
  ti_04.m_type_info = (type_info *)local_178;
  ti_04._16_8_ = local_168;
  Module::add(pMVar1,ti_04,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pMVar1 = local_10;
  user_type<std::exception>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"exception",&local_1d9);
  ti_05.m_bare_type_info = (type_info *)uStack_1b0;
  ti_05.m_type_info = (type_info *)local_1b8;
  ti_05._16_8_ = local_1a8;
  Module::add(pMVar1,ti_05,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  pMVar1 = local_10;
  local_200 = dispatch::Proxy_Function_Base::get_arity;
  local_1f8 = 0;
  fun<int(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const>
            ((chaiscript *)&local_1f0,(offset_in_Proxy_Function_Base_to_subr *)&local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"get_arity",&local_221);
  Module::add(pMVar1,&local_1f0,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1f0);
  pMVar1 = local_10;
  local_248[1] = 0;
  local_248[0] = 0x11;
  fun<bool(chaiscript::dispatch::Proxy_Function_Base::*)(chaiscript::dispatch::Proxy_Function_Base_const&)noexcept_const>
            ((chaiscript *)&local_238,local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"==",&local_269);
  pBVar2 = (Bootstrap *)&local_238;
  Module::add(pMVar1,(Proxy_Function *)pBVar2,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_238);
  pMVar1 = local_10;
  local_2a0.f = (offset_in_Proxy_Function_Base_to_subr)
                dispatch::Proxy_Function_Base::get_param_types;
  local_2a0._8_8_ = 0;
  local_290.f = (offset_in_Proxy_Function_Base_to_subr)
                return_boxed_value_vector<std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const>
                          (&local_2a0,pBVar2,f);
  fun<chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const>(std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*const&)()noexcept_const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_>
            ((chaiscript *)&local_280,&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"get_param_types",&local_2c1);
  pBVar2 = (Bootstrap *)&local_280;
  Module::add(pMVar1,(Proxy_Function *)pBVar2,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_280);
  pMVar1 = local_10;
  local_2f8._8_8_ = 0;
  local_2f8.f = 0x29;
  local_2e8.f = (offset_in_Proxy_Function_Base_to_subr)
                return_boxed_value_vector<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*)()const>
                          (&local_2f8,pBVar2,f_00);
  fun<chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*)()const>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*const&)()const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_>
            ((chaiscript *)&local_2d8,&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"get_contained_functions",&local_319);
  Module::add(pMVar1,&local_2d8,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_2d8);
  pMVar1 = local_10;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::exception_const&)_1_>
            ((chaiscript *)&local_330,&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"what",&local_359);
  Module::add(pMVar1,&local_330,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_330);
  pMVar1 = local_10;
  user_type<std::out_of_range>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"out_of_range",&local_399)
  ;
  ti_06.m_bare_type_info = (type_info *)uStack_370;
  ti_06.m_type_info = (type_info *)local_378;
  ti_06._16_8_ = local_368;
  Module::add(pMVar1,ti_06,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  pMVar1 = local_10;
  user_type<std::logic_error>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"logic_error",&local_3d9);
  ti_07.m_bare_type_info = (type_info *)uStack_3b0;
  ti_07.m_type_info = (type_info *)local_3b8;
  ti_07._16_8_ = local_3a8;
  Module::add(pMVar1,ti_07,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  pMVar1 = local_10;
  base_class<std::exception,std::logic_error>();
  Module::add(pMVar1,&local_3f0);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_3f0);
  pMVar1 = local_10;
  base_class<std::logic_error,std::out_of_range>();
  Module::add(pMVar1,&local_400);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_400);
  pMVar1 = local_10;
  base_class<std::exception,std::out_of_range>();
  Module::add(pMVar1,&local_410);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_410);
  pMVar1 = local_10;
  user_type<std::runtime_error>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"runtime_error",&local_449);
  ti_08.m_bare_type_info = (type_info *)uStack_420;
  ti_08.m_type_info = (type_info *)local_428;
  ti_08._16_8_ = local_418;
  Module::add(pMVar1,ti_08,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  pMVar1 = local_10;
  base_class<std::exception,std::runtime_error>();
  Module::add(pMVar1,&local_460);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_460);
  pMVar1 = local_10;
  constructor<std::runtime_error(std::__cxx11::string_const&)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"runtime_error",&local_491);
  Module::add(pMVar1,&local_470,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_470);
  pMVar1 = local_10;
  user_type<chaiscript::dispatch::Dynamic_Object>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"Dynamic_Object",&local_4d1);
  ti_09.m_bare_type_info = (type_info *)uStack_4a8;
  ti_09.m_type_info = (type_info *)local_4b0;
  ti_09._16_8_ = local_4a0;
  Module::add(pMVar1,ti_09,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  pMVar1 = local_10;
  constructor<chaiscript::dispatch::Dynamic_Object(std::__cxx11::string_const&)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"Dynamic_Object",&local_509);
  Module::add(pMVar1,&local_4e8,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4e8);
  pMVar1 = local_10;
  constructor<chaiscript::dispatch::Dynamic_Object()>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"Dynamic_Object",&local_541);
  Module::add(pMVar1,&local_520,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_520);
  pMVar1 = local_10;
  local_568 = dispatch::Dynamic_Object::get_type_name_abi_cxx11_;
  local_560 = 0;
  fun<std::__cxx11::string_const&(chaiscript::dispatch::Dynamic_Object::*)()noexcept_const>
            ((chaiscript *)&local_558,(offset_in_Dynamic_Object_to_subr *)&local_568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"get_type_name",&local_589);
  Module::add(pMVar1,&local_558,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_558);
  pMVar1 = local_10;
  local_5b0 = dispatch::Dynamic_Object::get_attrs_abi_cxx11_;
  local_5a8 = 0;
  fun<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>(chaiscript::dispatch::Dynamic_Object::*)()const>
            ((chaiscript *)&local_5a0,(offset_in_Dynamic_Object_to_subr *)&local_5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"get_attrs",&local_5d1);
  Module::add(pMVar1,&local_5a0,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_5a0);
  pMVar1 = local_10;
  local_5f8 = dispatch::Dynamic_Object::set_explicit;
  local_5f0 = 0;
  fun<void(chaiscript::dispatch::Dynamic_Object::*)(bool)noexcept>
            ((chaiscript *)&local_5e8,(offset_in_Dynamic_Object_to_subr *)&local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"set_explicit",&local_619)
  ;
  Module::add(pMVar1,&local_5e8,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_5e8);
  pMVar1 = local_10;
  local_640 = dispatch::Dynamic_Object::is_explicit;
  local_638 = 0;
  fun<bool(chaiscript::dispatch::Dynamic_Object::*)()noexcept_const>
            ((chaiscript *)&local_630,(offset_in_Dynamic_Object_to_subr *)&local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"is_explicit",&local_661);
  Module::add(pMVar1,&local_630,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_630);
  pMVar1 = local_10;
  local_688 = dispatch::Dynamic_Object::has_attr;
  local_680 = 0;
  fun<bool(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const>
            ((chaiscript *)&local_678,(offset_in_Dynamic_Object_to_subr *)&local_688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"has_attr",&local_6a9);
  Module::add(pMVar1,&local_678,&local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_678);
  pMVar1 = local_10;
  local_6d0 = dispatch::Dynamic_Object::get_attr;
  local_6c8 = 0;
  fun<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)>
            ((chaiscript *)&local_6c0,(offset_in_Dynamic_Object_to_subr *)&local_6d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"get_attr",&local_6f1);
  Module::add(pMVar1,&local_6c0,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_6c0);
  pMVar1 = local_10;
  local_718 = dispatch::Dynamic_Object::get_attr;
  local_710 = 0;
  fun<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const>
            ((chaiscript *)&local_708,(offset_in_Dynamic_Object_to_subr *)&local_718);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"get_attr",&local_739);
  Module::add(pMVar1,&local_708,&local_738);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_708);
  pMVar1 = local_10;
  local_760 = dispatch::Dynamic_Object::method_missing;
  local_758 = 0;
  fun<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)>
            ((chaiscript *)&local_750,(offset_in_Dynamic_Object_to_subr *)&local_760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,"method_missing",&local_781);
  Module::add(pMVar1,&local_750,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_750);
  pMVar1 = local_10;
  local_7a8 = dispatch::Dynamic_Object::method_missing;
  local_7a0 = 0;
  fun<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const>
            ((chaiscript *)&local_798,(offset_in_Dynamic_Object_to_subr *)&local_7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"method_missing",&local_7c9);
  Module::add(pMVar1,&local_798,&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_798);
  pMVar1 = local_10;
  local_7f0 = dispatch::Dynamic_Object::get_attr;
  local_7e8 = 0;
  fun<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)>
            ((chaiscript *)&local_7e0,(offset_in_Dynamic_Object_to_subr *)&local_7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"[]",&local_811);
  Module::add(pMVar1,&local_7e0,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_7e0);
  pMVar1 = local_10;
  local_838 = dispatch::Dynamic_Object::get_attr;
  local_830 = 0;
  fun<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const>
            ((chaiscript *)&local_828,(offset_in_Dynamic_Object_to_subr *)&local_838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"[]",&local_859);
  Module::add(pMVar1,&local_828,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_828);
  pMVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,
             "\n          def Dynamic_Object::clone() {\n            auto &new_o = Dynamic_Object(this.get_type_name());\n            for_each(this.get_attrs(), fun[new_o](x) { new_o.get_attr(x.first) = x.second; } );\n            new_o;\n          }\n\n          def `=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            for_each(rhs.get_attrs(), fun[lhs](x) { lhs.get_attr(x.first) = clone(x.second); } );\n          }\n\n          def `!=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            var rhs_attrs := rhs.get_attrs();\n            var lhs_attrs := lhs.get_attrs();\n\n            if (rhs_attrs.size() != lhs_attrs.size()) {\n              true;\n            } else {\n              return any_of(rhs_attrs, fun[lhs](x) { !lhs.has_attr(x.first) || lhs.get_attr(x.first) != x.second; } );\n            }\n          }\n\n          def `==`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            var rhs_attrs := rhs.get_attrs();\n            var lhs_attrs := lhs.get_attrs();\n\n            if (rhs_attrs.size() != lhs_attrs.size()) {\n              false;\n            } else {\n              return all_of(rhs_attrs, fun[lhs](x) { lhs.has_attr(x.first) && lhs.get_attr(x.first) == x.second; } );\n            }\n          }\n        "
             ,&local_881);
  Module::eval(pMVar1,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  pMVar1 = local_10;
  local_8a0 = has_guard;
  fun<bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>
            ((chaiscript *)&local_898,&local_8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"has_guard",&local_8c1);
  Module::add(pMVar1,&local_898,&local_8c0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_898);
  pMVar1 = local_10;
  local_8e0 = get_guard;
  fun<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_8d8,&local_8e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"get_guard",&local_901);
  Module::add(pMVar1,&local_8d8,&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_8d8);
  pMVar1 = local_10;
  local_928 = Boxed_Value::is_undef;
  local_920 = 0;
  fun<bool(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_918,(offset_in_Boxed_Value_to_subr *)&local_928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"is_var_undef",&local_949)
  ;
  Module::add(pMVar1,&local_918,&local_948);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_918);
  pMVar1 = local_10;
  local_970 = Boxed_Value::is_null;
  local_968 = 0;
  fun<bool(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_960,(offset_in_Boxed_Value_to_subr *)&local_970);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"is_var_null",&local_991);
  Module::add(pMVar1,&local_960,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_960);
  pMVar1 = local_10;
  local_9b8 = Boxed_Value::is_const;
  local_9b0 = 0;
  fun<bool(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_9a8,(offset_in_Boxed_Value_to_subr *)&local_9b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"is_var_const",&local_9d9)
  ;
  Module::add(pMVar1,&local_9a8,&local_9d8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_9a8);
  pMVar1 = local_10;
  local_a00 = Boxed_Value::is_ref;
  local_9f8 = 0;
  fun<bool(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_9f0,(offset_in_Boxed_Value_to_subr *)&local_a00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a20,"is_var_reference",&local_a21);
  Module::add(pMVar1,&local_9f0,&local_a20);
  std::__cxx11::string::~string((string *)&local_a20);
  std::allocator<char>::~allocator(&local_a21);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_9f0);
  pMVar1 = local_10;
  local_a48 = Boxed_Value::is_pointer;
  local_a40 = 0;
  fun<bool(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_a38,(offset_in_Boxed_Value_to_subr *)&local_a48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a68,"is_var_pointer",&local_a69);
  Module::add(pMVar1,&local_a38,&local_a68);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_a38);
  pMVar1 = local_10;
  local_a90 = Boxed_Value::is_return_value;
  local_a88 = 0;
  fun<bool(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_a80,(offset_in_Boxed_Value_to_subr *)&local_a90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab0,"is_var_return_value",&local_ab1);
  Module::add(pMVar1,&local_a80,&local_ab0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_a80);
  pMVar1 = local_10;
  local_ad8 = Boxed_Value::reset_return_value;
  local_ad0 = 0;
  fun<void(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_ac8,(offset_in_Boxed_Value_to_subr *)&local_ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,"reset_var_return_value",&local_af9);
  Module::add(pMVar1,&local_ac8,&local_af8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_ac8);
  pMVar1 = local_10;
  local_b20 = Boxed_Value::is_type;
  local_b18 = 0;
  fun<bool(chaiscript::Boxed_Value::*)(chaiscript::Type_Info_const&)noexcept_const>
            ((chaiscript *)&local_b10,(offset_in_Boxed_Value_to_subr *)&local_b20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b40,"is_type",&local_b41);
  Module::add(pMVar1,&local_b10,&local_b40);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator(&local_b41);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b10);
  pMVar1 = local_10;
  local_b68 = Boxed_Value::get_attr;
  local_b60 = 0;
  fun<chaiscript::Boxed_Value(chaiscript::Boxed_Value::*)(std::__cxx11::string_const&)>
            ((chaiscript *)&local_b58,(offset_in_Boxed_Value_to_subr *)&local_b68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b88,"get_var_attr",&local_b89)
  ;
  Module::add(pMVar1,&local_b58,&local_b88);
  std::__cxx11::string::~string((string *)&local_b88);
  std::allocator<char>::~allocator(&local_b89);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b58);
  pMVar1 = local_10;
  local_bb0 = Boxed_Value::copy_attrs;
  local_ba8 = 0;
  fun<chaiscript::Boxed_Value&(chaiscript::Boxed_Value::*)(chaiscript::Boxed_Value_const&)>
            ((chaiscript *)&local_ba0,(offset_in_Boxed_Value_to_subr *)&local_bb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd0,"copy_var_attrs",&local_bd1);
  Module::add(pMVar1,&local_ba0,&local_bd0);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_ba0);
  pMVar1 = local_10;
  local_bf8 = Boxed_Value::clone_attrs;
  local_bf0 = 0;
  fun<chaiscript::Boxed_Value&(chaiscript::Boxed_Value::*)(chaiscript::Boxed_Value_const&)>
            ((chaiscript *)&local_be8,(offset_in_Boxed_Value_to_subr *)&local_bf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c18,"clone_var_attrs",&local_c19);
  Module::add(pMVar1,&local_be8,&local_c18);
  std::__cxx11::string::~string((string *)&local_c18);
  std::allocator<char>::~allocator(&local_c19);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_be8);
  pMVar1 = local_10;
  local_c40 = Boxed_Value::get_type_info;
  local_c38 = 0;
  fun<chaiscript::Type_Info_const&(chaiscript::Boxed_Value::*)()noexcept_const>
            ((chaiscript *)&local_c30,(offset_in_Boxed_Value_to_subr *)&local_c40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c60,"get_type_info",&local_c61);
  Module::add(pMVar1,&local_c30,&local_c60);
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator(&local_c61);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_c30);
  pMVar1 = local_10;
  user_type<chaiscript::Type_Info>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca0,"Type_Info",&local_ca1);
  ti_10.m_bare_type_info = (type_info *)uStack_c78;
  ti_10.m_type_info = (type_info *)local_c80;
  ti_10._16_8_ = local_c70;
  Module::add(pMVar1,ti_10,&local_ca0);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::allocator<char>::~allocator(&local_ca1);
  pMVar1 = local_10;
  constructor<chaiscript::Type_Info(chaiscript::Type_Info_const&)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd8,"Type_Info",&local_cd9);
  Module::add(pMVar1,&local_cb8,&local_cd8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_cb8);
  operators::equal<chaiscript::Type_Info>(local_10);
  pMVar1 = local_10;
  local_d00 = Type_Info::is_const;
  local_cf8 = 0;
  fun<bool(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_cf0,(offset_in_Type_Info_to_subr *)&local_d00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d20,"is_type_const",&local_d21);
  Module::add(pMVar1,&local_cf0,&local_d20);
  std::__cxx11::string::~string((string *)&local_d20);
  std::allocator<char>::~allocator(&local_d21);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_cf0);
  pMVar1 = local_10;
  local_d48 = Type_Info::is_reference;
  local_d40 = 0;
  fun<bool(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_d38,(offset_in_Type_Info_to_subr *)&local_d48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d68,"is_type_reference",&local_d69);
  Module::add(pMVar1,&local_d38,&local_d68);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator(&local_d69);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_d38);
  pMVar1 = local_10;
  local_d90 = Type_Info::is_void;
  local_d88 = 0;
  fun<bool(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_d80,(offset_in_Type_Info_to_subr *)&local_d90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_db0,"is_type_void",&local_db1)
  ;
  Module::add(pMVar1,&local_d80,&local_db0);
  std::__cxx11::string::~string((string *)&local_db0);
  std::allocator<char>::~allocator(&local_db1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_d80);
  pMVar1 = local_10;
  local_dd8 = Type_Info::is_undef;
  local_dd0 = 0;
  fun<bool(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_dc8,(offset_in_Type_Info_to_subr *)&local_dd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_df8,"is_type_undef",&local_df9);
  Module::add(pMVar1,&local_dc8,&local_df8);
  std::__cxx11::string::~string((string *)&local_df8);
  std::allocator<char>::~allocator(&local_df9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_dc8);
  pMVar1 = local_10;
  local_e20 = Type_Info::is_pointer;
  local_e18 = 0;
  fun<bool(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_e10,(offset_in_Type_Info_to_subr *)&local_e20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e40,"is_type_pointer",&local_e41);
  Module::add(pMVar1,&local_e10,&local_e40);
  std::__cxx11::string::~string((string *)&local_e40);
  std::allocator<char>::~allocator(&local_e41);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_e10);
  pMVar1 = local_10;
  local_e68 = Type_Info::is_arithmetic;
  local_e60 = 0;
  fun<bool(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_e58,(offset_in_Type_Info_to_subr *)&local_e68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e88,"is_type_arithmetic",&local_e89);
  Module::add(pMVar1,&local_e58,&local_e88);
  std::__cxx11::string::~string((string *)&local_e88);
  std::allocator<char>::~allocator(&local_e89);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_e58);
  pMVar1 = local_10;
  local_eb0 = Type_Info::name;
  local_ea8 = 0;
  fun<char_const*(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_ea0,(offset_in_Type_Info_to_subr *)&local_eb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ed0,"cpp_name",&local_ed1);
  Module::add(pMVar1,&local_ea0,&local_ed0);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::allocator<char>::~allocator(&local_ed1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_ea0);
  pMVar1 = local_10;
  local_ef8 = Type_Info::bare_name;
  local_ef0 = 0;
  fun<char_const*(chaiscript::Type_Info::*)()noexcept_const>
            ((chaiscript *)&local_ee8,(offset_in_Type_Info_to_subr *)&local_ef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f18,"cpp_bare_name",&local_f19);
  Module::add(pMVar1,&local_ee8,&local_f18);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator(&local_f19);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_ee8);
  pMVar1 = local_10;
  local_f40 = Type_Info::bare_equal;
  local_f38 = 0;
  fun<bool(chaiscript::Type_Info::*)(chaiscript::Type_Info_const&)noexcept_const>
            ((chaiscript *)&local_f30,(offset_in_Type_Info_to_subr *)&local_f40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f60,"bare_equal",&local_f61);
  Module::add(pMVar1,&local_f30,&local_f60);
  std::__cxx11::string::~string((string *)&local_f60);
  std::allocator<char>::~allocator(&local_f61);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_f30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f88,"bool",&local_f89);
  basic_constructors<bool>(&local_f88,local_10);
  std::__cxx11::string::~string((string *)&local_f88);
  std::allocator<char>::~allocator(&local_f89);
  operators::assign<bool>(local_10);
  operators::equal<bool>(local_10);
  operators::not_equal<bool>(local_10);
  pMVar1 = local_10;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::__cxx11::string_const&)_1_>
            ((chaiscript *)&local_fa0,&local_fa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc8,"to_string",&local_fc9);
  Module::add(pMVar1,&local_fa0,&local_fc8);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::allocator<char>::~allocator(&local_fc9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_fa0);
  pMVar1 = local_10;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(bool)_1_>
            ((chaiscript *)&local_fe0,&local_fe1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1008,"to_string",&local_1009);
  Module::add(pMVar1,&local_fe0,&local_1008);
  std::__cxx11::string::~string((string *)&local_1008);
  std::allocator<char>::~allocator(&local_1009);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_fe0);
  pMVar1 = local_10;
  local_1028 = unknown_assign;
  fun<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,chaiscript::Boxed_Value)>
            ((chaiscript *)&local_1020,&local_1028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1048,"=",&local_1049);
  Module::add(pMVar1,&local_1020,&local_1048);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator(&local_1049);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1020);
  pMVar1 = local_10;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::Boxed_Value_const&)_1_>
            ((chaiscript *)&local_1060,&local_1061);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1088,"throw",&local_1089);
  Module::add(pMVar1,&local_1060,&local_1088);
  std::__cxx11::string::~string((string *)&local_1088);
  std::allocator<char>::~allocator(&local_1089);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1060);
  pMVar1 = local_10;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(char)_1_>
            ((chaiscript *)&local_10a0,&local_10a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10c8,"to_string",&local_10c9);
  Module::add(pMVar1,&local_10a0,&local_10c8);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::allocator<char>::~allocator(&local_10c9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_10a0);
  pMVar1 = local_10;
  local_10f0 = Boxed_Number::to_string_abi_cxx11_;
  local_10e8 = 0;
  fun<std::__cxx11::string(chaiscript::Boxed_Number::*)()const>
            ((chaiscript *)&local_10e0,(offset_in_Boxed_Number_to_subr *)&local_10f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1110,"to_string",&local_1111);
  Module::add(pMVar1,&local_10e0,&local_1110);
  std::__cxx11::string::~string((string *)&local_1110);
  std::allocator<char>::~allocator(&local_1111);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_10e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1138,"double",&local_1139);
  bootstrap_pod_type<double>(&local_1138,local_10);
  std::__cxx11::string::~string((string *)&local_1138);
  std::allocator<char>::~allocator(&local_1139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1160,"long_double",&local_1161);
  bootstrap_pod_type<long_double>(&local_1160,local_10);
  std::__cxx11::string::~string((string *)&local_1160);
  std::allocator<char>::~allocator(&local_1161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1188,"float",&local_1189);
  bootstrap_pod_type<float>(&local_1188,local_10);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11b0,"int",&local_11b1);
  bootstrap_pod_type<int>(&local_11b0,local_10);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::allocator<char>::~allocator(&local_11b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11d8,"long",&local_11d9);
  bootstrap_pod_type<long>(&local_11d8,local_10);
  std::__cxx11::string::~string((string *)&local_11d8);
  std::allocator<char>::~allocator(&local_11d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1200,"unsigned_int",&local_1201);
  bootstrap_pod_type<unsigned_int>(&local_1200,local_10);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator(&local_1201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1228,"unsigned_long",&local_1229);
  bootstrap_pod_type<unsigned_long>(&local_1228,local_10);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator(&local_1229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,"long_long",&local_1251);
  bootstrap_pod_type<long_long>(&local_1250,local_10);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1278,"unsigned_long_long",&local_1279);
  bootstrap_pod_type<unsigned_long_long>(&local_1278,local_10);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator(&local_1279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12a0,"size_t",&local_12a1);
  bootstrap_pod_type<unsigned_long>(&local_12a0,local_10);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator(&local_12a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12c8,"char",&local_12c9);
  bootstrap_pod_type<char>(&local_12c8,local_10);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::allocator<char>::~allocator(&local_12c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12f0,"wchar_t",&local_12f1);
  bootstrap_pod_type<wchar_t>(&local_12f0,local_10);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator(&local_12f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1318,"char16_t",&local_1319);
  bootstrap_pod_type<char16_t>(&local_1318,local_10);
  std::__cxx11::string::~string((string *)&local_1318);
  std::allocator<char>::~allocator(&local_1319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1340,"char32_t",&local_1341);
  bootstrap_pod_type<char32_t>(&local_1340,local_10);
  std::__cxx11::string::~string((string *)&local_1340);
  std::allocator<char>::~allocator(&local_1341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1368,"int8_t",&local_1369);
  bootstrap_pod_type<signed_char>(&local_1368,local_10);
  std::__cxx11::string::~string((string *)&local_1368);
  std::allocator<char>::~allocator(&local_1369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1390,"int16_t",&local_1391);
  bootstrap_pod_type<short>(&local_1390,local_10);
  std::__cxx11::string::~string((string *)&local_1390);
  std::allocator<char>::~allocator(&local_1391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13b8,"int32_t",&local_13b9);
  bootstrap_pod_type<int>(&local_13b8,local_10);
  std::__cxx11::string::~string((string *)&local_13b8);
  std::allocator<char>::~allocator(&local_13b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13e0,"int64_t",&local_13e1);
  bootstrap_pod_type<long>(&local_13e0,local_10);
  std::__cxx11::string::~string((string *)&local_13e0);
  std::allocator<char>::~allocator(&local_13e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1408,"uint8_t",&local_1409);
  bootstrap_pod_type<unsigned_char>(&local_1408,local_10);
  std::__cxx11::string::~string((string *)&local_1408);
  std::allocator<char>::~allocator(&local_1409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1430,"uint16_t",&local_1431);
  bootstrap_pod_type<unsigned_short>(&local_1430,local_10);
  std::__cxx11::string::~string((string *)&local_1430);
  std::allocator<char>::~allocator(&local_1431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1458,"uint32_t",&local_1459);
  bootstrap_pod_type<unsigned_int>(&local_1458,local_10);
  std::__cxx11::string::~string((string *)&local_1458);
  std::allocator<char>::~allocator(&local_1459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1480,"uint64_t",&local_1481);
  bootstrap_pod_type<unsigned_long>(&local_1480,local_10);
  std::__cxx11::string::~string((string *)&local_1480);
  std::allocator<char>::~allocator(&local_1481);
  operators::logical_compliment<bool>(local_10);
  opers_arithmetic_pod(local_10);
  pMVar1 = local_10;
  local_14a0 = Build_Info::version_major;
  fun<int(*)()noexcept>((chaiscript *)&local_1498,&local_14a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c0,"version_major",&local_14c1);
  Module::add(pMVar1,&local_1498,&local_14c0);
  std::__cxx11::string::~string((string *)&local_14c0);
  std::allocator<char>::~allocator(&local_14c1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1498);
  pMVar1 = local_10;
  local_14e0 = Build_Info::version_minor;
  fun<int(*)()noexcept>((chaiscript *)&local_14d8,&local_14e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1500,"version_minor",&local_1501);
  Module::add(pMVar1,&local_14d8,&local_1500);
  std::__cxx11::string::~string((string *)&local_1500);
  std::allocator<char>::~allocator(&local_1501);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_14d8);
  pMVar1 = local_10;
  local_1520 = Build_Info::version_patch;
  fun<int(*)()noexcept>((chaiscript *)&local_1518,&local_1520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1540,"version_patch",&local_1541);
  Module::add(pMVar1,&local_1518,&local_1540);
  std::__cxx11::string::~string((string *)&local_1540);
  std::allocator<char>::~allocator(&local_1541);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1518);
  pMVar1 = local_10;
  local_1560 = Build_Info::version_abi_cxx11_;
  fun<std::__cxx11::string(*)()>((chaiscript *)&local_1558,&local_1560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1580,"version",&local_1581);
  Module::add(pMVar1,&local_1558,&local_1580);
  std::__cxx11::string::~string((string *)&local_1580);
  std::allocator<char>::~allocator(&local_1581);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1558);
  pMVar1 = local_10;
  local_15a0 = Build_Info::compiler_version_abi_cxx11_;
  fun<std::__cxx11::string(*)()>((chaiscript *)&local_1598,&local_15a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15c0,"compiler_version",&local_15c1);
  Module::add(pMVar1,&local_1598,&local_15c0);
  std::__cxx11::string::~string((string *)&local_15c0);
  std::allocator<char>::~allocator(&local_15c1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1598);
  pMVar1 = local_10;
  local_15e0 = Build_Info::compiler_name_abi_cxx11_;
  fun<std::__cxx11::string(*)()>((chaiscript *)&local_15d8,&local_15e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1600,"compiler_name",&local_1601);
  Module::add(pMVar1,&local_15d8,&local_1600);
  std::__cxx11::string::~string((string *)&local_1600);
  std::allocator<char>::~allocator(&local_1601);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_15d8);
  pMVar1 = local_10;
  local_1620 = Build_Info::compiler_id_abi_cxx11_;
  fun<std::__cxx11::string(*)()>((chaiscript *)&local_1618,&local_1620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1640,"compiler_id",&local_1641);
  Module::add(pMVar1,&local_1618,&local_1640);
  std::__cxx11::string::~string((string *)&local_1640);
  std::allocator<char>::~allocator(&local_1641);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1618);
  pMVar1 = local_10;
  local_1660 = Build_Info::debug_build;
  fun<bool(*)()noexcept>((chaiscript *)&local_1658,&local_1660);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1680,"debug_build",&local_1681);
  Module::add(pMVar1,&local_1658,&local_1680);
  std::__cxx11::string::~string((string *)&local_1680);
  std::allocator<char>::~allocator(&local_1681);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1658);
  pMVar1 = local_10;
  local_16a0 = print;
  fun<void(*)(std::__cxx11::string_const&)noexcept>((chaiscript *)&local_1698,&local_16a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16c0,"print_string",&local_16c1);
  Module::add(pMVar1,&local_1698,&local_16c0);
  std::__cxx11::string::~string((string *)&local_16c0);
  std::allocator<char>::~allocator(&local_16c1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1698);
  pMVar1 = local_10;
  local_16e0 = println;
  fun<void(*)(std::__cxx11::string_const&)noexcept>((chaiscript *)&local_16d8,&local_16e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1700,"println_string",&local_1701);
  Module::add(pMVar1,&local_16d8,&local_1700);
  std::__cxx11::string::~string((string *)&local_1700);
  std::allocator<char>::~allocator(&local_1701);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_16d8);
  pMVar1 = local_10;
  local_1720 = bind_function;
  dispatch::
  make_dynamic_proxy_function<chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>
            ((dispatch *)&local_1718,&local_1720);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1740,"bind",&local_1741);
  Module::add(pMVar1,&local_1718,&local_1740);
  std::__cxx11::string::~string((string *)&local_1740);
  std::allocator<char>::~allocator(&local_1741);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1718);
  pMVar1 = local_10;
  local_1760 = shared_ptr_unconst_clone<chaiscript::dispatch::Proxy_Function_Base>;
  fun<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_1758,&local_1760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1780,"clone",&local_1781);
  Module::add(pMVar1,&local_1758,&local_1780);
  std::__cxx11::string::~string((string *)&local_1780);
  std::allocator<char>::~allocator(&local_1781);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1758);
  pMVar1 = local_10;
  local_17a0 = ptr_assign<chaiscript::dispatch::Proxy_Function_Base>;
  fun<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)>
            ((chaiscript *)&local_1798,&local_17a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17c0,"=",&local_17c1);
  Module::add(pMVar1,&local_1798,&local_17c0);
  std::__cxx11::string::~string((string *)&local_17c0);
  std::allocator<char>::~allocator(&local_17c1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1798);
  pMVar1 = local_10;
  local_17e0 = ptr_assign<chaiscript::dispatch::Proxy_Function_Base_const>;
  fun<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_17d8,&local_17e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1800,"=",&local_1801);
  Module::add(pMVar1,&local_17d8,&local_1800);
  std::__cxx11::string::~string((string *)&local_1800);
  std::allocator<char>::~allocator(&local_1801);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_17d8);
  pMVar1 = local_10;
  base_class<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Assignable_Proxy_Function>
            ();
  Module::add(pMVar1,&local_1818);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_1818);
  pMVar1 = local_10;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_>
            ((chaiscript *)&local_1828,&local_1829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1850,"=",&local_1851);
  Module::add(pMVar1,&local_1828,&local_1850);
  std::__cxx11::string::~string((string *)&local_1850);
  std::allocator<char>::~allocator(&local_1851);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1828);
  pMVar1 = local_10;
  local_1870 = Boxed_Value::type_match;
  fun<bool(*)(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)noexcept>
            ((chaiscript *)&local_1868,&local_1870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1890,"type_match",&local_1891)
  ;
  Module::add(pMVar1,&local_1868,&local_1890);
  std::__cxx11::string::~string((string *)&local_1890);
  std::allocator<char>::~allocator(&local_1891);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1868);
  pMVar1 = local_10;
  local_18b0 = has_parse_tree;
  fun<bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>
            ((chaiscript *)&local_18a8,&local_18b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18d0,"has_parse_tree",&local_18d1);
  Module::add(pMVar1,&local_18a8,&local_18d0);
  std::__cxx11::string::~string((string *)&local_18d0);
  std::allocator<char>::~allocator(&local_18d1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_18a8);
  pMVar1 = local_10;
  local_18f0 = get_parse_tree;
  fun<chaiscript::AST_Node_const&(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_18e8,&local_18f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1910,"get_parse_tree",&local_1911);
  Module::add(pMVar1,&local_18e8,&local_1910);
  std::__cxx11::string::~string((string *)&local_1910);
  std::allocator<char>::~allocator(&local_1911);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_18e8);
  pMVar1 = local_10;
  base_class<std::runtime_error,chaiscript::exception::eval_error>();
  Module::add(pMVar1,&local_1928);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_1928);
  pMVar1 = local_10;
  base_class<std::exception,chaiscript::exception::eval_error>();
  Module::add(pMVar1,&local_1938);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_1938);
  pMVar1 = local_10;
  user_type<chaiscript::exception::arithmetic_error>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1970,"arithmetic_error",&local_1971);
  ti_11.m_bare_type_info = (type_info *)uStack_1948;
  ti_11.m_type_info = (type_info *)local_1950;
  ti_11._16_8_ = local_1940;
  Module::add(pMVar1,ti_11,&local_1970);
  std::__cxx11::string::~string((string *)&local_1970);
  std::allocator<char>::~allocator(&local_1971);
  pMVar1 = local_10;
  base_class<std::runtime_error,chaiscript::exception::arithmetic_error>();
  Module::add(pMVar1,&local_1988);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_1988);
  pMVar1 = local_10;
  base_class<std::exception,chaiscript::exception::arithmetic_error>();
  Module::add(pMVar1,&local_1998);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_1998);
  pMVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_19b8,"eval_error",&local_19b9)
  ;
  local_19d8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_19d8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19d8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&local_19d8);
  local_1ae2 = 1;
  local_1a98 = &local_1a90;
  local_1ab0 = 0x10;
  fun<std::__cxx11::string_chaiscript::exception::eval_error::*>
            ((chaiscript *)&local_1aa8,&local_1ab0);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[7],_true>
            (&local_1a90,&local_1aa8,(char (*) [7])"reason");
  local_1ad0 = exception::eval_error::pretty_print_abi_cxx11_;
  local_1ac8 = 0;
  local_1a98 = &local_1a60;
  fun<std::__cxx11::string(chaiscript::exception::eval_error::*)()const>
            ((chaiscript *)&local_1ac0,(offset_in_eval_error_to_subr *)&local_1ad0);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[13],_true>
            (&local_1a60,&local_1ac0,(char (*) [13])"pretty_print");
  local_1a98 = &local_1a30;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::exception::eval_error_const&)_1_>
            ((chaiscript *)&local_1ae0,&local_1ae1);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[11],_true>
            (&local_1a30,&local_1ae0,(char (*) [11])"call_stack");
  local_1ae2 = 0;
  local_1a00._0_8_ = &local_1a90;
  local_1a00._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  std::
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_1ae3);
  __l_02._M_len = local_1a00._8_8_;
  __l_02._M_array = (iterator)local_1a00._0_8_;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1a00 + 0x10),__l_02,&local_1ae3);
  utility::add_class<chaiscript::exception::eval_error,chaiscript::Module>
            (pMVar1,&local_19b8,&local_19d8,
             (vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_1a00 + 0x10));
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a00 + 0x10));
  std::
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_1ae3);
  local_2548 = (pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1a00;
  do {
    local_2548 = local_2548 + -1;
    std::
    pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_2548);
  } while (local_2548 != &local_1a90);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1ae0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1ac0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1aa8);
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_19d8);
  std::__cxx11::string::~string((string *)&local_19b8);
  std::allocator<char>::~allocator(&local_19b9);
  pMVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b08,"File_Position",&local_1b09);
  local_1b60 = local_1b58;
  constructor<chaiscript::File_Position()>();
  local_1b60 = local_1b58 + 0x10;
  constructor<chaiscript::File_Position(int,int)>();
  local_1b38.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1b58;
  local_1b38.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>::allocator
            (&local_1b61);
  __l_01._M_len =
       (size_type)
       local_1b38.
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  __l_01._M_array =
       (iterator)
       local_1b38.
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&local_1b28,__l_01,&local_1b61);
  local_1c29 = 1;
  local_1bf8 = &local_1bf0;
  local_1c10 = 0;
  fun<int_chaiscript::File_Position::*>((chaiscript *)&local_1c08,&local_1c10);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[5],_true>
            (&local_1bf0,&local_1c08,(char (*) [5])"line");
  local_1c28 = 4;
  local_1bf8 = &local_1bc0;
  fun<int_chaiscript::File_Position::*>((chaiscript *)&local_1c20,&local_1c28);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[7],_true>
            (&local_1bc0,&local_1c20,(char (*) [7])"column");
  local_1c29 = 0;
  local_1b90._0_8_ = &local_1bf0;
  local_1b90._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  std::
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_1c2a);
  __l_00._M_len = local_1b90._8_8_;
  __l_00._M_array = (iterator)local_1b90._0_8_;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1b90 + 0x10),__l_00,&local_1c2a);
  utility::add_class<chaiscript::File_Position,chaiscript::Module>
            (pMVar1,&local_1b08,&local_1b28,
             (vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_1b90 + 0x10));
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1b90 + 0x10));
  std::
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_1c2a);
  local_2588 = (pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b90;
  do {
    local_2588 = local_2588 + -1;
    std::
    pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_2588);
  } while (local_2588 != &local_1bf0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1c20);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1c08);
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_1b28);
  std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>::~allocator
            (&local_1b61);
  local_25a0 = &local_1b38;
  do {
    local_25a0 = local_25a0 + -1;
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_25a0);
  } while (local_25a0 != (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_1b58);
  std::__cxx11::string::~string((string *)&local_1b08);
  std::allocator<char>::~allocator(&local_1b09);
  pMVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c50,"AST_Node",&local_1c51);
  local_1c78.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c78.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c78.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&local_1c78);
  local_1eba = 1;
  local_1df8 = &local_1df0;
  local_1e10 = 0x10;
  fun<std::__cxx11::string_const_chaiscript::AST_Node::*>((chaiscript *)&local_1e08,&local_1e10);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[5],_true>
            (&local_1df0,&local_1e08,(char (*) [5])"text");
  local_1e28 = 8;
  local_1df8 = &local_1dc0;
  fun<chaiscript::AST_Node_Type_const_chaiscript::AST_Node::*>
            ((chaiscript *)&local_1e20,&local_1e28);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[11],_true>
            (&local_1dc0,&local_1e20,(char (*) [11])"identifier");
  local_1e48 = AST_Node::filename_abi_cxx11_;
  local_1e40 = 0;
  local_1df8 = &local_1d90;
  fun<std::__cxx11::string_const&(chaiscript::AST_Node::*)()noexcept_const>
            ((chaiscript *)&local_1e38,(offset_in_AST_Node_to_subr *)&local_1e48);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[9],_true>
            (&local_1d90,&local_1e38,(char (*) [9])"filename");
  local_1e68 = AST_Node::start;
  local_1e60 = 0;
  local_1df8 = &local_1d60;
  fun<chaiscript::File_Position_const&(chaiscript::AST_Node::*)()noexcept_const>
            ((chaiscript *)&local_1e58,(offset_in_AST_Node_to_subr *)&local_1e68);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[6],_true>
            (&local_1d60,&local_1e58,(char (*) [6])"start");
  local_1e88 = AST_Node::end;
  local_1e80 = 0;
  local_1df8 = &local_1d30;
  fun<chaiscript::File_Position_const&(chaiscript::AST_Node::*)()noexcept_const>
            ((chaiscript *)&local_1e78,(offset_in_AST_Node_to_subr *)&local_1e88);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[4],_true>
            (&local_1d30,&local_1e78,(char (*) [4])0x75f851);
  local_1ea8 = AST_Node::to_string;
  local_1ea0 = 0;
  local_1df8 = &local_1d00;
  fun<std::__cxx11::string(chaiscript::AST_Node::*)(std::__cxx11::string_const&)const>
            ((chaiscript *)&local_1e98,(offset_in_AST_Node_to_subr *)&local_1ea8);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[10],_true>
            (&local_1d00,&local_1e98,(char (*) [10])"to_string");
  local_1df8 = &local_1cd0;
  fun<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::AST_Node_const&)_1_>
            ((chaiscript *)&local_1eb8,&local_1eb9);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[9],_true>
            (&local_1cd0,&local_1eb8,(char (*) [9])"children");
  local_1eba = 0;
  local_1ca0._0_8_ = &local_1df0;
  local_1ca0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
  std::
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_1ebb);
  __l._M_len = local_1ca0._8_8_;
  __l._M_array = (iterator)local_1ca0._0_8_;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1ca0 + 0x10),__l,&local_1ebb);
  utility::add_class<chaiscript::AST_Node,chaiscript::Module>
            (pMVar1,&local_1c50,&local_1c78,
             (vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_1ca0 + 0x10));
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1ca0 + 0x10));
  std::
  allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_1ebb);
  local_2600 = (pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1ca0;
  do {
    local_2600 = local_2600 + -1;
    std::
    pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_2600);
  } while (local_2600 != &local_1df0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1eb8);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e98);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e78);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e58);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e38);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e20);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e08);
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_1c78);
  std::__cxx11::string::~string((string *)&local_1c50);
  std::allocator<char>::~allocator(&local_1c51);
  return;
}

Assistant:

static void bootstrap(Module &m) {
      m.add(user_type<void>(), "void");
      m.add(user_type<bool>(), "bool");
      m.add(user_type<Boxed_Value>(), "Object");
      m.add(user_type<Boxed_Number>(), "Number");
      m.add(user_type<Proxy_Function>(), "Function");
      m.add(user_type<dispatch::Assignable_Proxy_Function>(), "Assignable_Function");
      m.add(user_type<std::exception>(), "exception");

      m.add(fun(&dispatch::Proxy_Function_Base::get_arity), "get_arity");
      m.add(fun(&dispatch::Proxy_Function_Base::operator==), "==");

      m.add(fun(return_boxed_value_vector(&dispatch::Proxy_Function_Base::get_param_types)), "get_param_types");
      m.add(fun(return_boxed_value_vector(&dispatch::Proxy_Function_Base::get_contained_functions)), "get_contained_functions");

      m.add(fun([](const std::exception &e) { return std::string(e.what()); }), "what");

      m.add(user_type<std::out_of_range>(), "out_of_range");
      m.add(user_type<std::logic_error>(), "logic_error");
      m.add(chaiscript::base_class<std::exception, std::logic_error>());
      m.add(chaiscript::base_class<std::logic_error, std::out_of_range>());
      m.add(chaiscript::base_class<std::exception, std::out_of_range>());

      m.add(user_type<std::runtime_error>(), "runtime_error");
      m.add(chaiscript::base_class<std::exception, std::runtime_error>());

      m.add(constructor<std::runtime_error(const std::string &)>(), "runtime_error");

      m.add(user_type<dispatch::Dynamic_Object>(), "Dynamic_Object");
      m.add(constructor<dispatch::Dynamic_Object(const std::string &)>(), "Dynamic_Object");
      m.add(constructor<dispatch::Dynamic_Object()>(), "Dynamic_Object");
      m.add(fun(&dispatch::Dynamic_Object::get_type_name), "get_type_name");
      m.add(fun(&dispatch::Dynamic_Object::get_attrs), "get_attrs");
      m.add(fun(&dispatch::Dynamic_Object::set_explicit), "set_explicit");
      m.add(fun(&dispatch::Dynamic_Object::is_explicit), "is_explicit");
      m.add(fun(&dispatch::Dynamic_Object::has_attr), "has_attr");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::get_attr)), "get_attr");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(&dispatch::Dynamic_Object::get_attr)),
            "get_attr");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::method_missing)),
            "method_missing");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(
                &dispatch::Dynamic_Object::method_missing)),
            "method_missing");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::get_attr)), "[]");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(&dispatch::Dynamic_Object::get_attr)),
            "[]");

      m.eval(R"chaiscript(
          def Dynamic_Object::clone() {
            auto &new_o = Dynamic_Object(this.get_type_name());
            for_each(this.get_attrs(), fun[new_o](x) { new_o.get_attr(x.first) = x.second; } );
            new_o;
          }

          def `=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            for_each(rhs.get_attrs(), fun[lhs](x) { lhs.get_attr(x.first) = clone(x.second); } );
          }

          def `!=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            var rhs_attrs := rhs.get_attrs();
            var lhs_attrs := lhs.get_attrs();

            if (rhs_attrs.size() != lhs_attrs.size()) {
              true;
            } else {
              return any_of(rhs_attrs, fun[lhs](x) { !lhs.has_attr(x.first) || lhs.get_attr(x.first) != x.second; } );
            }
          }

          def `==`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            var rhs_attrs := rhs.get_attrs();
            var lhs_attrs := lhs.get_attrs();

            if (rhs_attrs.size() != lhs_attrs.size()) {
              false;
            } else {
              return all_of(rhs_attrs, fun[lhs](x) { lhs.has_attr(x.first) && lhs.get_attr(x.first) == x.second; } );
            }
          }
        )chaiscript");

      m.add(fun(&has_guard), "has_guard");
      m.add(fun(&get_guard), "get_guard");

      m.add(fun(&Boxed_Value::is_undef), "is_var_undef");
      m.add(fun(&Boxed_Value::is_null), "is_var_null");
      m.add(fun(&Boxed_Value::is_const), "is_var_const");
      m.add(fun(&Boxed_Value::is_ref), "is_var_reference");
      m.add(fun(&Boxed_Value::is_pointer), "is_var_pointer");
      m.add(fun(&Boxed_Value::is_return_value), "is_var_return_value");
      m.add(fun(&Boxed_Value::reset_return_value), "reset_var_return_value");
      m.add(fun(&Boxed_Value::is_type), "is_type");
      m.add(fun(&Boxed_Value::get_attr), "get_var_attr");
      m.add(fun(&Boxed_Value::copy_attrs), "copy_var_attrs");
      m.add(fun(&Boxed_Value::clone_attrs), "clone_var_attrs");

      m.add(fun(&Boxed_Value::get_type_info), "get_type_info");
      m.add(user_type<Type_Info>(), "Type_Info");
      m.add(constructor<Type_Info(const Type_Info &)>(), "Type_Info");

      operators::equal<Type_Info>(m);

      m.add(fun(&Type_Info::is_const), "is_type_const");
      m.add(fun(&Type_Info::is_reference), "is_type_reference");
      m.add(fun(&Type_Info::is_void), "is_type_void");
      m.add(fun(&Type_Info::is_undef), "is_type_undef");
      m.add(fun(&Type_Info::is_pointer), "is_type_pointer");
      m.add(fun(&Type_Info::is_arithmetic), "is_type_arithmetic");
      m.add(fun(&Type_Info::name), "cpp_name");
      m.add(fun(&Type_Info::bare_name), "cpp_bare_name");
      m.add(fun(&Type_Info::bare_equal), "bare_equal");

      basic_constructors<bool>("bool", m);
      operators::assign<bool>(m);
      operators::equal<bool>(m);
      operators::not_equal<bool>(m);

      m.add(fun([](const std::string &s) { return s; }), "to_string");
      m.add(fun([](const bool b) { return std::string(b ? "true" : "false"); }), "to_string");
      m.add(fun(&unknown_assign), "=");
      m.add(fun([](const Boxed_Value &bv) { throw bv; }), "throw");

      m.add(fun([](const char c) { return std::string(1, c); }), "to_string");
      m.add(fun(&Boxed_Number::to_string), "to_string");

      bootstrap_pod_type<double>("double", m);
      bootstrap_pod_type<long double>("long_double", m);
      bootstrap_pod_type<float>("float", m);
      bootstrap_pod_type<int>("int", m);
      bootstrap_pod_type<long>("long", m);
      bootstrap_pod_type<unsigned int>("unsigned_int", m);
      bootstrap_pod_type<unsigned long>("unsigned_long", m);
      bootstrap_pod_type<long long>("long_long", m);
      bootstrap_pod_type<unsigned long long>("unsigned_long_long", m);
      bootstrap_pod_type<size_t>("size_t", m);
      bootstrap_pod_type<char>("char", m);
      bootstrap_pod_type<wchar_t>("wchar_t", m);
      bootstrap_pod_type<char16_t>("char16_t", m);
      bootstrap_pod_type<char32_t>("char32_t", m);
      bootstrap_pod_type<std::int8_t>("int8_t", m);
      bootstrap_pod_type<std::int16_t>("int16_t", m);
      bootstrap_pod_type<std::int32_t>("int32_t", m);
      bootstrap_pod_type<std::int64_t>("int64_t", m);
      bootstrap_pod_type<std::uint8_t>("uint8_t", m);
      bootstrap_pod_type<std::uint16_t>("uint16_t", m);
      bootstrap_pod_type<std::uint32_t>("uint32_t", m);
      bootstrap_pod_type<std::uint64_t>("uint64_t", m);

      operators::logical_compliment<bool>(m);

      opers_arithmetic_pod(m);

      m.add(fun(&Build_Info::version_major), "version_major");
      m.add(fun(&Build_Info::version_minor), "version_minor");
      m.add(fun(&Build_Info::version_patch), "version_patch");
      m.add(fun(&Build_Info::version), "version");
      m.add(fun(&Build_Info::compiler_version), "compiler_version");
      m.add(fun(&Build_Info::compiler_name), "compiler_name");
      m.add(fun(&Build_Info::compiler_id), "compiler_id");
      m.add(fun(&Build_Info::debug_build), "debug_build");

      m.add(fun(&print), "print_string");
      m.add(fun(&println), "println_string");

      m.add(dispatch::make_dynamic_proxy_function(&bind_function), "bind");

      m.add(fun(&shared_ptr_unconst_clone<dispatch::Proxy_Function_Base>), "clone");
      m.add(fun(&ptr_assign<std::remove_const<dispatch::Proxy_Function_Base>::type>), "=");
      m.add(fun(&ptr_assign<std::add_const<dispatch::Proxy_Function_Base>::type>), "=");
      m.add(chaiscript::base_class<dispatch::Proxy_Function_Base, dispatch::Assignable_Proxy_Function>());
      m.add(fun([](dispatch::Assignable_Proxy_Function &t_lhs, const std::shared_ptr<const dispatch::Proxy_Function_Base> &t_rhs) {
              t_lhs.assign(t_rhs);
            }),
            "=");

      m.add(fun(&Boxed_Value::type_match), "type_match");

      m.add(chaiscript::fun(&has_parse_tree), "has_parse_tree");
      m.add(chaiscript::fun(&get_parse_tree), "get_parse_tree");

      m.add(chaiscript::base_class<std::runtime_error, chaiscript::exception::eval_error>());
      m.add(chaiscript::base_class<std::exception, chaiscript::exception::eval_error>());

      m.add(chaiscript::user_type<chaiscript::exception::arithmetic_error>(), "arithmetic_error");
      m.add(chaiscript::base_class<std::runtime_error, chaiscript::exception::arithmetic_error>());
      m.add(chaiscript::base_class<std::exception, chaiscript::exception::arithmetic_error>());

      //        chaiscript::bootstrap::standard_library::vector_type<std::vector<std::shared_ptr<chaiscript::AST_Node> >
      //        >("AST_NodeVector", m);

      chaiscript::utility::add_class<chaiscript::exception::eval_error>(m,
                                                                        "eval_error",
                                                                        {},
                                                                        {{fun(&chaiscript::exception::eval_error::reason), "reason"},
                                                                         {fun(&chaiscript::exception::eval_error::pretty_print), "pretty_print"},
                                                                         {fun([](const chaiscript::exception::eval_error &t_eval_error) {
                                                                            std::vector<Boxed_Value> retval;
                                                                            std::transform(t_eval_error.call_stack.begin(),
                                                                                           t_eval_error.call_stack.end(),
                                                                                           std::back_inserter(retval),
                                                                                           &chaiscript::var<const chaiscript::AST_Node_Trace &>);
                                                                            return retval;
                                                                          }),
                                                                          "call_stack"}});

      chaiscript::utility::add_class<chaiscript::File_Position>(m,
                                                                "File_Position",
                                                                {constructor<File_Position()>(), constructor<File_Position(int, int)>()},
                                                                {{fun(&File_Position::line), "line"},
                                                                 {fun(&File_Position::column), "column"}});

      chaiscript::utility::add_class<AST_Node>(m,
                                               "AST_Node",
                                               {},
                                               {{fun(&AST_Node::text), "text"},
                                                {fun(&AST_Node::identifier), "identifier"},
                                                {fun(&AST_Node::filename), "filename"},
                                                {fun(&AST_Node::start), "start"},
                                                {fun(&AST_Node::end), "end"},
                                                {fun(&AST_Node::to_string), "to_string"},
                                                {fun([](const chaiscript::AST_Node &t_node) -> std::vector<Boxed_Value> {
                                                   std::vector<Boxed_Value> retval;
                                                   const auto children = t_node.get_children();
                                                   std::transform(children.begin(),
                                                                  children.end(),
                                                                  std::back_inserter(retval),
                                                                  &chaiscript::var<const std::reference_wrapper<chaiscript::AST_Node> &>);
                                                   return retval;
                                                 }),
                                                 "children"}});
    }